

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

BigInt * __thiscall BigInt::operator%(BigInt *__return_storage_ptr__,BigInt *this,BigInt *v)

{
  BigInt local_90;
  BigInt local_70;
  pair<BigInt,_BigInt> local_50;
  
  BigInt(&local_70,this);
  BigInt(&local_90,v);
  divModBig(&local_50,&local_70,&local_90);
  BigInt(__return_storage_ptr__,&local_50.second);
  std::pair<BigInt,_BigInt>::~pair(&local_50);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_90);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

BigInt operator%(const BigInt &v) const {
        return divModBig(*this, v).second;
    }